

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

void __thiscall DepfileParserTestSpecialChars::Run(DepfileParserTestSpecialChars *this)

{
  Test *pTVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  undefined4 local_40;
  undefined1 local_30 [8];
  string err;
  DepfileParserTestSpecialChars *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  pTVar1 = g_current_test;
  bVar2 = DepfileParserTest::Parse
                    (&this->super_DepfileParserTest,anon_var_dwarf_48007,(string *)local_30);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
             ,0xc0,
             "Parse( \"C:/Program\\\\ Files\\\\ (x86)/Microsoft\\\\ crtdefs.h: \\\\\\n\" \" en@quot.header~ t+t-x!=1 \\\\\\n\" \" openldap/slapd.d/cn=config/cn=schema/cn={0}core.ldif\\\\\\n\" \" Fu\\303\\244ball\\\\\\n\" \" a[1]b@2%c\", &err)"
            );
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                     ,0xc1,"\"\" == err");
  pTVar1 = g_current_test;
  if (bVar2) {
    sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                      (&(this->super_DepfileParserTest).parser_.outs_);
    bVar2 = testing::Test::Check
                      (pTVar1,sVar3 == 1,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                       ,0xc2,"1u == parser_.outs_.size()");
    pTVar1 = g_current_test;
    if (bVar2) {
      pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                         (&(this->super_DepfileParserTest).parser_.outs_,0);
      StringPiece::AsString_abi_cxx11_(&local_60,pvVar4);
      bVar2 = std::operator==("C:/Program Files (x86)/Microsoft crtdefs.h",&local_60);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                 ,0xc4,
                 "\"C:/Program Files (x86)/Microsoft crtdefs.h\" == parser_.outs_[0].AsString()");
      std::__cxx11::string::~string((string *)&local_60);
      pTVar1 = g_current_test;
      sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                        (&(this->super_DepfileParserTest).parser_.ins_);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar3 == 5,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                         ,0xc5,"5u == parser_.ins_.size()");
      pTVar1 = g_current_test;
      if (bVar2) {
        pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           (&(this->super_DepfileParserTest).parser_.ins_,0);
        StringPiece::AsString_abi_cxx11_(&local_80,pvVar4);
        bVar2 = std::operator==("en@quot.header~",&local_80);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                   ,199,"\"en@quot.header~\" == parser_.ins_[0].AsString()");
        std::__cxx11::string::~string((string *)&local_80);
        pTVar1 = g_current_test;
        pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           (&(this->super_DepfileParserTest).parser_.ins_,1);
        StringPiece::AsString_abi_cxx11_(&local_a0,pvVar4);
        bVar2 = std::operator==("t+t-x!=1",&local_a0);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                   ,0xc9,"\"t+t-x!=1\" == parser_.ins_[1].AsString()");
        std::__cxx11::string::~string((string *)&local_a0);
        pTVar1 = g_current_test;
        pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           (&(this->super_DepfileParserTest).parser_.ins_,2);
        StringPiece::AsString_abi_cxx11_(&local_c0,pvVar4);
        bVar2 = std::operator==("openldap/slapd.d/cn=config/cn=schema/cn={0}core.ldif",&local_c0);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                   ,0xcb,
                   "\"openldap/slapd.d/cn=config/cn=schema/cn={0}core.ldif\" == parser_.ins_[2].AsString()"
                  );
        std::__cxx11::string::~string((string *)&local_c0);
        pTVar1 = g_current_test;
        pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           (&(this->super_DepfileParserTest).parser_.ins_,3);
        StringPiece::AsString_abi_cxx11_(&local_e0,pvVar4);
        bVar2 = std::operator==(anon_var_dwarf_480a5,&local_e0);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                   ,0xcd,"\"Fu\\303\\244ball\" == parser_.ins_[3].AsString()");
        std::__cxx11::string::~string((string *)&local_e0);
        pTVar1 = g_current_test;
        pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           (&(this->super_DepfileParserTest).parser_.ins_,4);
        StringPiece::AsString_abi_cxx11_(&local_100,pvVar4);
        bVar2 = std::operator==(anon_var_dwarf_48007 + 0x90,&local_100);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                   ,0xcf,"\"a[1]b@2%c\" == parser_.ins_[4].AsString()");
        std::__cxx11::string::~string((string *)&local_100);
        local_40 = 0;
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_40 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_40 = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    local_40 = 1;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(DepfileParserTest, SpecialChars) {
  // See filenames like istreambuf.iterator_op!= in
  // https://github.com/google/libcxx/tree/master/test/iterators/stream.iterators/istreambuf.iterator/
  string err;
  EXPECT_TRUE(Parse(
"C:/Program\\ Files\\ (x86)/Microsoft\\ crtdefs.h: \\\n"
" en@quot.header~ t+t-x!=1 \\\n"
" openldap/slapd.d/cn=config/cn=schema/cn={0}core.ldif\\\n"
" Fu\303\244ball\\\n"
" a[1]b@2%c",
      &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, parser_.outs_.size());
  EXPECT_EQ("C:/Program Files (x86)/Microsoft crtdefs.h",
            parser_.outs_[0].AsString());
  ASSERT_EQ(5u, parser_.ins_.size());
  EXPECT_EQ("en@quot.header~",
            parser_.ins_[0].AsString());
  EXPECT_EQ("t+t-x!=1",
            parser_.ins_[1].AsString());
  EXPECT_EQ("openldap/slapd.d/cn=config/cn=schema/cn={0}core.ldif",
            parser_.ins_[2].AsString());
  EXPECT_EQ("Fu\303\244ball",
            parser_.ins_[3].AsString());
  EXPECT_EQ("a[1]b@2%c",
            parser_.ins_[4].AsString());
}